

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

Generator * kratos::MergeWireAssignmentsVisitor::get_parent(StmtBlock *block)

{
  int iVar1;
  undefined4 extraout_var;
  StmtException *this;
  Generator *pGVar3;
  int iVar4;
  initializer_list<kratos::IRNode_*> __l;
  StmtBlock *local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_60;
  string local_48;
  allocator_type local_21;
  StmtBlock *pSVar2;
  
  iVar4 = 10000;
  pSVar2 = block;
  do {
    iVar1 = (*(pSVar2->super_Stmt).super_IRNode._vptr_IRNode[4])(pSVar2);
    pSVar2 = (StmtBlock *)CONCAT44(extraout_var,iVar1);
    if ((pSVar2->super_Stmt).super_IRNode.ast_node_type_ == GeneratorKind) {
      pGVar3 = (Generator *)__dynamic_cast(pSVar2,&IRNode::typeinfo,&Generator::typeinfo,0);
      if (pGVar3 != (Generator *)0x0) {
        return pGVar3;
      }
      break;
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  this = (StmtException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Cannot find parent for the statement block","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  local_68 = block;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_60,__l,&local_21);
  StmtException::StmtException(this,&local_48,&local_60);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Generator* get_parent(StmtBlock* block) {
        Generator* result = nullptr;
        IRNode* node = block;
        for (uint32_t i = 0; i < 10000u; i++) {
            auto* p = node->parent();
            if (p->ir_node_kind() == IRNodeKind::GeneratorKind) {
                result = dynamic_cast<Generator*>(p);
                break;
            }
            node = p;
        }
        if (!result) {
            throw StmtException("Cannot find parent for the statement block", {block});
        }
        return result;
    }